

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printJPG(JPG *jpg)

{
  MCU *pMVar1;
  Block *paiVar2;
  uint uVar3;
  ostream *poVar4;
  Block **ppaiVar5;
  pointer pSVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint ID;
  int *piVar11;
  ulong uVar12;
  uint q;
  long lVar13;
  pointer pSVar14;
  uint i;
  ulong uVar15;
  ulong local_58;
  ulong local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"width:",6);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"height:",7);
  lVar8 = 1;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ComponentID:",0xc);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    uVar7 = jpg->mcuHeight;
    if (uVar7 != 0) {
      uVar15 = (ulong)jpg->mcuWidth;
      local_58 = 0;
      do {
        if ((int)uVar15 == 0) {
          uVar15 = 0;
        }
        else {
          uVar12 = 0;
          do {
            pMVar1 = jpg->data;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"muc Row:",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," mcu column:",0xc);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
            ID = (uint)lVar8;
            uVar3 = JPG::getVerticalSamplingFrequency(jpg,ID);
            if (uVar3 != 0) {
              local_50 = 0;
              do {
                uVar3 = JPG::getHorizontalSamplingFrequency(jpg,ID);
                if (uVar3 != 0) {
                  uVar10 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Block row:",10);
                    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4," Block column:",0xe);
                    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
                    ppaiVar5 = MCU::operator[](pMVar1 + (uint)((int)uVar15 * (int)local_58 +
                                                              (int)uVar12),ID);
                    paiVar2 = *ppaiVar5;
                    uVar3 = JPG::getHorizontalSamplingFrequency(jpg,ID);
                    piVar11 = paiVar2[uVar3 * (int)local_50 + (int)uVar10];
                    lVar9 = 0;
                    do {
                      lVar13 = 0;
                      do {
                        poVar4 = (ostream *)
                                 std::ostream::operator<<((ostream *)&std::cout,piVar11[lVar13]);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 != 8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"\n",1);
                      lVar9 = lVar9 + 1;
                      piVar11 = piVar11 + 8;
                    } while (lVar9 != 8);
                    uVar10 = uVar10 + 1;
                    uVar3 = JPG::getHorizontalSamplingFrequency(jpg,ID);
                  } while (uVar10 < uVar3);
                }
                local_50 = local_50 + 1;
                uVar3 = JPG::getVerticalSamplingFrequency(jpg,ID);
              } while (local_50 < uVar3);
            }
            uVar12 = uVar12 + 1;
            uVar15 = (ulong)jpg->mcuWidth;
          } while (uVar12 < uVar15);
          uVar7 = jpg->mcuHeight;
        }
        local_58 = local_58 + 1;
      } while (local_58 < uVar7);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DC Tables 0 ",0xc);
  uVar15 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    pSVar6 = (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar14 = (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar14 != pSVar6;
        pSVar14 = pSVar14 + 1) {
      if (uVar15 == pSVar14->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        pSVar6 = (jpg->yDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DC Tables 1 ",0xc);
  uVar15 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    pSVar6 = (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pSVar14 = (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar14 != pSVar6;
        pSVar14 = pSVar14 + 1) {
      if (uVar15 == pSVar14->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        pSVar6 = (jpg->chromaDC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AC Tables 0 ",0xc);
  uVar15 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    pSVar6 = (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar14 = (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar14 != pSVar6;
        pSVar14 = pSVar14 + 1) {
      if (uVar15 == pSVar14->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        pSVar6 = (jpg->yAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AC Tables 1 ",0xc);
  uVar15 = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"length:",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":::",3);
    pSVar6 = (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pSVar14 = (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                   _M_impl.super__Vector_impl_data._M_start; pSVar14 != pSVar6;
        pSVar14 = pSVar14 + 1) {
      if (uVar15 == pSVar14->codeLength) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
        pSVar6 = (jpg->chromaAC).sortedSymbol.super__Vector_base<Symbol,_std::allocator<Symbol>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x11);
  return;
}

Assistant:

void printJPG(const JPG& jpg) {
    std::cout << "width:" << jpg.width << " " << "height:" << jpg.height << "\n";
    for (uint componentID = 1; componentID <= 3; componentID++) {
        std::cout << "ComponentID:" << componentID << "\n";
        for (uint i = 0; i < jpg.mcuHeight; i++) {
            for (uint j = 0; j < jpg.mcuWidth; j++) {
                MCU& mcu = jpg.data[i * jpg.mcuWidth + j];
                std::cout << "muc Row:" << i << " mcu column:" << j << "\n";
                for (uint ii = 0; ii < jpg.getVerticalSamplingFrequency(componentID); ii++) {
                    for (uint jj = 0; jj < jpg.getHorizontalSamplingFrequency(componentID); jj++) {
                        std::cout << "Block row:" << ii << " Block column:" << jj << "\n";
                        Block& block = mcu[componentID][ii * jpg.getHorizontalSamplingFrequency(componentID) + jj];
                        for(uint k = 0; k < 8; k++) {
                            for(uint q = 0; q < 8; q++) {
                                std::cout << block[k * 8 + q] << " ";
                            }
                            std::cout << "\n";
                        }
                    }
                }
            }
        }
    }
    std::cout << "DC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yDC.sortedSymbol.cbegin(); it != jpg.yDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "DC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaDC.sortedSymbol.cbegin(); it != jpg.chromaDC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";

    }
    std::cout << "AC Tables 0 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.yAC.sortedSymbol.cbegin(); it != jpg.yAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
    std::cout << "AC Tables 1 "<< "\n";
    for(uint i = 1; i <= 16; i++) {
        std::cout << "length:" << i << ":::";
        for(auto it = jpg.chromaAC.sortedSymbol.cbegin(); it != jpg.chromaAC.sortedSymbol.cend(); it++) {
            if(it->codeLength == i) {
                std::cout << (uint)it->symbol << "  ";
            }
        }
        std::cout << "\n";
    }
}